

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool openjtalk_speakToFileSjis(OpenJTalk *oj,char *textSjis,char *fileSjis)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *__stream;
  OpenJTalk *oj_00;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  _Bool result;
  char *buf;
  FILE *wavfp;
  char file_utf8 [260];
  FILE *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char local_128 [272];
  char *local_18;
  long local_10;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RDX == (char *)0x0) || (in_RSI == (char *)0x0)) {
      *(undefined4 *)(in_RDI + 0x678) = 2;
    }
    else {
      local_18 = in_RSI;
      local_10 = in_RDI;
      sVar2 = strlen(in_RDX);
      if ((sVar2 != 0) && (sVar2 = strlen(local_18), sVar2 != 0)) {
        pcVar3 = sjistou8_path((char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                               ,(char *)in_stack_fffffffffffffeb8);
        if (pcVar3 == (char *)0x0) {
          return false;
        }
        __stream = fopen(local_128,"wb");
        if (__stream == (FILE *)0x0) {
          *(undefined4 *)(local_10 + 0x678) = 8;
          return false;
        }
        oj_00 = (OpenJTalk *)sjistou8((char *)0x19d32c);
        if (oj_00 == (OpenJTalk *)0x0) {
          return false;
        }
        bVar1 = generate_wavFile(oj_00,(char *)CONCAT17(in_stack_fffffffffffffec7,
                                                        in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffeb8);
        free(oj_00);
        fclose(__stream);
        return (_Bool)(bVar1 & 1);
      }
      *(undefined4 *)(local_10 + 0x678) = 2;
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileSjis(OpenJTalk *oj, const char *textSjis, const char *fileSjis)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (fileSjis == NULL || textSjis == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlen(fileSjis) == 0 || strlen(textSjis) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = fopen(fileSjis, u8"wb");
#else
	char file_utf8[MAX_PATH];
	if (!sjistou8_path(fileSjis, file_utf8))
	{
		return false;
	}
	FILE *wavfp = fopen(file_utf8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = sjistou8(textSjis);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	free(buf);
	fclose(wavfp);
	return result;
}